

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fastpfor.h
# Opt level: O0

void __thiscall
FastPForLib::FastPForImpl<4U,_unsigned_int>::__decodeArray
          (FastPForImpl<4U,_unsigned_int> *this,uint32_t *in,size_t *length,uint *out,size_t nvalue)

{
  uint *puVar1;
  reference this_00;
  reference puVar2;
  long in_RCX;
  byte *pbVar3;
  long *in_RDX;
  uint *in_RSI;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RDI;
  ulong in_R8;
  uint8_t pos_1;
  uint32_t k_3;
  const_iterator *exceptionsptr;
  uint8_t pos;
  uint32_t k_2;
  uint8_t maxbits;
  uint8_t cexcept;
  uint8_t b;
  uint32_t run;
  uint32_t k_1;
  const_iterator unpackpointers [33];
  uint32_t tnvalue;
  uint32_t k;
  uint bitmap;
  uint8_t *bytep;
  uint32_t bytesize;
  uint32_t *inexcept;
  uint32_t wheremeta;
  uint32_t *headerin;
  uint32_t *initin;
  pointer *this_01;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  *this_02;
  pointer *this_03;
  uint *in_stack_fffffffffffffe38;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_1b8;
  byte local_1ad;
  uint local_1ac;
  pointer *local_1a8;
  byte local_19d;
  uint local_19c;
  byte local_197;
  byte local_196;
  byte local_195;
  uint local_194;
  uint *local_190;
  pointer local_188;
  uint local_17c;
  pointer local_178 [20];
  uint32_t in_stack_ffffffffffffff2c;
  size_t in_stack_ffffffffffffff30;
  uint *in_stack_ffffffffffffff38;
  uint32_t *in_stack_ffffffffffffff40;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  _Stack_70;
  uint32_t local_64;
  uint local_60;
  uint local_5c;
  uint *local_58;
  uint local_4c;
  uint32_t *local_48;
  uint local_3c;
  uint *local_30;
  ulong local_28;
  long local_20;
  long *local_18;
  uint *local_10;
  
  local_10 = in_RSI + 1;
  local_3c = *in_RSI;
  local_58 = in_RSI + local_3c + 1;
  local_4c = in_RSI[local_3c];
  puVar1 = (uint *)(((ulong)local_4c + 3 & 0xfffffffffffffffc) + (long)local_58);
  local_5c = *puVar1;
  local_48 = puVar1 + 1;
  local_30 = in_RSI;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  for (local_60 = 2; local_60 < 0x21; local_60 = local_60 + 1) {
    if (((ulong)local_5c & 1L << ((char)local_60 - 1U & 0x3f)) != 0) {
      local_64 = *local_48;
      std::
      vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    *)&(in_RDI->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                       _M_impl.super__Vector_impl_data._M_finish,(ulong)local_60);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                (in_RDI,(size_type)in_stack_fffffffffffffe38);
      std::
      vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    *)&(in_RDI->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                       _M_impl.super__Vector_impl_data._M_finish,(ulong)local_60);
      in_stack_fffffffffffffe38 =
           std::vector<unsigned_int,_std::allocator<unsigned_int>_>::data
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x13bdf0);
      this_00 = std::
                vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                              *)&(in_RDI->
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                 _M_impl.super__Vector_impl_data._M_finish,(ulong)local_60);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(this_00);
      local_48 = packingvector<32U>::unpackmetight<unsigned_int>
                           (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
                            in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c);
      std::
      vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    *)&(in_RDI->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                       _M_impl.super__Vector_impl_data._M_finish,(ulong)local_60);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                (in_RDI,(size_type)in_stack_fffffffffffffe38);
    }
  }
  *local_18 = (long)local_48 - (long)local_30 >> 2;
  this_02 = &_Stack_70;
  this_03 = local_178;
  do {
    this_01 = this_03;
    __gnu_cxx::
    __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
    ::__normal_iterator((__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                         *)this_01);
    this_03 = this_01 + 1;
  } while ((__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
            *)this_03 != this_02);
  for (local_17c = 1; local_17c < 0x21; local_17c = local_17c + 1) {
    std::
    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  *)&(in_RDI->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                     _M_impl.super__Vector_impl_data._M_finish,(ulong)local_17c);
    local_190 = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_01);
    __gnu_cxx::
    __normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>::
    __normal_iterator<unsigned_int*>
              (this_02,(__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                        *)this_01);
    local_178[local_17c] = local_188;
  }
  for (local_194 = 0; (ulong)local_194 < local_28 >> 7; local_194 = local_194 + 1) {
    pbVar3 = (byte *)((long)local_58 + 1);
    local_195 = (byte)*local_58;
    local_58 = (uint *)((long)local_58 + 2);
    local_196 = *pbVar3;
    local_10 = unpackblock<128u,unsigned_int>((uint32_t *)this_02,(uint *)this_01,0);
    if (local_196 != 0) {
      local_197 = (byte)*local_58;
      if ((uint)local_197 - (uint)local_195 == 1) {
        local_58 = (uint *)((long)local_58 + 1);
        for (local_19c = 0; local_19c < local_196; local_19c = local_19c + 1) {
          local_19d = (byte)*local_58;
          *(uint *)(local_20 + (ulong)local_19d * 4) =
               *(uint *)(local_20 + (ulong)local_19d * 4) | (uint)(1L << (local_195 & 0x3f));
          local_58 = (uint *)((long)local_58 + 1);
        }
      }
      else {
        local_1a8 = local_178 + (int)((uint)local_197 - (uint)local_195);
        local_58 = (uint *)((long)local_58 + 1);
        for (local_1ac = 0; local_1ac < local_196; local_1ac = local_1ac + 1) {
          local_1ad = (byte)*local_58;
          local_58 = (uint *)((long)local_58 + 1);
          local_1b8 = __gnu_cxx::
                      __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                      ::operator++((__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                    *)this_03,(int)((ulong)this_02 >> 0x20));
          puVar2 = __gnu_cxx::
                   __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                   ::operator*(&local_1b8);
          *(uint *)(local_20 + (ulong)local_1ad * 4) =
               *(uint *)(local_20 + (ulong)local_1ad * 4) | *puVar2 << (local_195 & 0x3f);
        }
      }
    }
    local_20 = local_20 + 0x200;
  }
  return;
}

Assistant:

void __decodeArray(const uint32_t *in, size_t &length, IntType *out,
                     const size_t nvalue) {
    const uint32_t *const initin = in;
    const uint32_t *const headerin = in++;
    const uint32_t wheremeta = headerin[0];
    const uint32_t *inexcept = headerin + wheremeta;
    const uint32_t bytesize = *inexcept++;
    const uint8_t *bytep = reinterpret_cast<const uint8_t *>(inexcept);
    inexcept += (bytesize + sizeof(uint32_t) - 1) / sizeof(uint32_t);
    IntType bitmap = *(reinterpret_cast<const IntType *>(inexcept));
    inexcept += (sizeof(IntType) + sizeof(uint32_t) - 1) / sizeof(uint32_t);
    for (uint32_t k = 2; k <= sizeof(IntType) * 8; ++k) {
      if ((bitmap & (1ULL << (k - 1))) != 0) {
        uint32_t tnvalue = *inexcept;
        datatobepacked[k].resize((tnvalue + PACKSIZE - 1) / PACKSIZE * PACKSIZE);
        inexcept = packingvector<32>::unpackmetight(
            inexcept, datatobepacked[k].data(), datatobepacked[k].size(), k);
        datatobepacked[k].resize(tnvalue);
      }
    }
    length = inexcept - initin;
    typename std::vector<IntType>::const_iterator
        unpackpointers[sizeof(IntType) * 8 + 1];
    for (uint32_t k = 1; k <= sizeof(IntType) * 8; ++k) {
      unpackpointers[k] = datatobepacked[k].begin();
    }
    for (uint32_t run = 0; run < nvalue / BlockSize; ++run, out += BlockSize) {
      const uint8_t b = *bytep++;
      const uint8_t cexcept = *bytep++;
      in = unpackblock<BlockSize>(in, out, b);
      if (cexcept > 0) {
        const uint8_t maxbits = *bytep++;
        if (maxbits - b == 1) {
          for (uint32_t k = 0; k < cexcept; ++k) {
            const uint8_t pos = *(bytep++);
            out[pos] |= static_cast<uint64_t>(1) << b;
          }
        } else {
          typename std::vector<IntType>::const_iterator &exceptionsptr =
              unpackpointers[maxbits - b];
          for (uint32_t k = 0; k < cexcept; ++k) {
            const uint8_t pos = *(bytep++);
            out[pos] |= (static_cast<uint64_t>(*(exceptionsptr++))) << b;
          }
        }
      }
    }
    assert(in == headerin + wheremeta);
  }